

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O0

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int64(Value_type_to_xml *this,int64_t val)

{
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int64_t local_18;
  int64_t val_local;
  Value_type_to_xml *this_local;
  
  local_18 = val;
  val_local = (int64_t)this;
  boost::lexical_cast<std::__cxx11::string,long>(&local_38,(boost *)&local_18,in_RDX);
  add_textnode(this,"i8",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int64(int64_t val)
{
  add_textnode("i8", boost::lexical_cast<std::string>(val));
}